

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<axl::sl::Packer*,axl::sl::ArrayDetails<axl::sl::Packer*>>::
setCountImpl<axl::sl::SimpleArrayDetails<axl::sl::Packer*>::Construct>
          (Array<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_> *this,size_t count)

{
  bool bVar1;
  size_t sVar2;
  BufHdr *pBVar3;
  BufHdr *pBVar4;
  BufHdr *this_00;
  ulong in_RSI;
  long *in_RDI;
  Packer **p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  bool result;
  size_t size;
  BufHdr *in_stack_ffffffffffffff68;
  BufHdr *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  Construct local_59;
  BufHdr *local_58;
  undefined4 local_50;
  Ptr local_40 [16];
  size_t in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  Construct in_stack_ffffffffffffffdf;
  bool local_1;
  
  if ((in_RDI[1] != 0) && (sVar2 = rc::RefCount::getRefCount((RefCount *)in_RDI[1]), sVar2 == 1)) {
    if (in_RDI[2] == in_RSI) {
      return true;
    }
    if (in_RSI << 3 <= *(ulong *)(in_RDI[1] + 0x18)) {
      if ((ulong)in_RDI[2] < in_RSI) {
        SimpleArrayDetails<axl::sl::Packer_*>::Construct::operator()
                  ((Construct *)&stack0xffffffffffffffdf,(Packer **)(*in_RDI + in_RDI[2] * 8),
                   in_RSI - in_RDI[2]);
      }
      else {
        SimpleArrayDetails<axl::sl::Packer_*>::destruct
                  ((Packer **)(*in_RDI + in_RSI * 8),in_RDI[2] - in_RSI);
      }
      SimpleArrayDetails<axl::sl::Packer_*>::setHdrCount((Hdr *)in_RDI[1],in_RSI);
      in_RDI[2] = in_RSI;
      return true;
    }
  }
  if (in_RSI == 0) {
    ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>::release
              ((ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_> *)
               in_stack_ffffffffffffff70);
    local_1 = true;
  }
  else if (in_RDI[2] == 0) {
    bVar1 = Array<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>::reserve
                      ((Array<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_> *)
                       CONCAT17(in_stack_ffffffffffffffdf,
                                CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                       in_stack_ffffffffffffffd0);
    if (bVar1) {
      SimpleArrayDetails<axl::sl::Packer_*>::Construct::operator()
                ((Construct *)&stack0xffffffffffffffdd,(Packer **)*in_RDI,in_RSI);
      SimpleArrayDetails<axl::sl::Packer_*>::setHdrCount((Hdr *)in_RDI[1],in_RSI);
      in_RDI[2] = in_RSI;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    getAllocSize(0x17cf8e);
    pBVar3 = (BufHdr *)mem::allocate(0x17cfa1);
    rc::BufHdr::BufHdr(pBVar3,in_stack_ffffffffffffff78,(uintptr_t)in_stack_ffffffffffffff70);
    rc::primeRefCount<axl::rc::BufHdr>
              (in_stack_ffffffffffffff70,(FreeFunc *)in_stack_ffffffffffffff68);
    rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>
              ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
    if (pBVar4 == (BufHdr *)0x0) {
      local_1 = false;
    }
    else {
      pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      SimpleArrayDetails<axl::sl::Packer_*>::setHdrCount(pBVar4,in_RSI);
      this_00 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      local_58 = this_00 + 1;
      if ((ulong)in_RDI[2] < in_RSI) {
        SimpleArrayDetails<axl::sl::Packer_*>::constructCopy
                  ((Packer **)this_00,(Packer **)in_stack_ffffffffffffff68,0x17d0b3);
        SimpleArrayDetails<axl::sl::Packer_*>::Construct::operator()
                  (&local_59,(Packer **)(&(local_58->super_RefCount)._vptr_RefCount + in_RDI[2]),
                   in_RSI - in_RDI[2]);
      }
      else {
        SimpleArrayDetails<axl::sl::Packer_*>::constructCopy
                  ((Packer **)this_00,(Packer **)in_stack_ffffffffffffff68,0x17d099);
      }
      rc::RefCount::release(&this_00->super_RefCount);
      *in_RDI = (long)local_58;
      pBVar3 = rc::Ptr<axl::rc::BufHdr>::detach((Ptr<axl::rc::BufHdr> *)pBVar3,(RefCount **)pBVar4);
      in_RDI[1] = (long)pBVar3;
      in_RDI[2] = in_RSI;
      local_1 = true;
    }
    local_50 = 1;
    rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x17d144);
  }
  return local_1;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}